

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O2

void clear_rec(kdnode *node,_func_void_void_ptr *destr)

{
  if (node != (kdnode *)0x0) {
    clear_rec(node->left,destr);
    clear_rec(node->right,destr);
    if (destr != (_func_void_void_ptr *)0x0) {
      (*destr)(node->data);
    }
    free(node->pos);
    free(node);
    return;
  }
  return;
}

Assistant:

static void clear_rec(struct kdnode *node, void (*destr)(void*))
{
	if(!node) return;

	clear_rec(node->left, destr);
	clear_rec(node->right, destr);
	
	if(destr) {
		destr(node->data);
	}
	free(node->pos);
	free(node);
}